

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall
FileTest_OpenBufferedFileError_Test::TestBody(FileTest_OpenBufferedFileError_Test *this)

{
  bool bVar1;
  system_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  int in_stack_0000018c;
  undefined1 in_stack_00000190 [16];
  char *in_stack_ffffffffffffff28;
  basic_string_view<char> *in_stack_ffffffffffffff30;
  file *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  Type in_stack_ffffffffffffff5c;
  AssertionResult *this_00;
  int in_stack_ffffffffffffff74;
  file *in_stack_ffffffffffffff78;
  cstring_view in_stack_ffffffffffffff80;
  basic_cstring_view<char> local_68;
  byte local_59;
  Message *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  string local_48 [48];
  AssertionResult local_18;
  
  this_00 = &local_18;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    fmt::v5::basic_string_view<char>::basic_string_view
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    format_system_error_abi_cxx11_(in_stack_0000018c,(string_view)in_stack_00000190);
    local_59 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_ffffffffffffff5c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
    if (bVar1) {
      fmt::v5::basic_cstring_view<char>::basic_cstring_view(&local_68,"nonexistent");
      fmt::v5::file::file(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff74);
      fmt::v5::file::~file(in_stack_ffffffffffffff40);
    }
    bVar1 = (local_59 & 1) != 0;
    if (!bVar1) {
      testing::AssertionResult::operator<<
                (this_00,(char (*) [120])
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    std::__cxx11::string::~string(local_48);
    if (bVar1) goto LAB_00113472;
  }
  testing::Message::Message((Message *)this_00);
  testing::AssertionResult::failure_message((AssertionResult *)0x1133e4);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff4c,(char *)in_stack_ffffffffffffff40);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff30);
  testing::Message::~Message((Message *)0x113430);
LAB_00113472:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11347f);
  return;
}

Assistant:

TEST(FileTest, OpenBufferedFileError) {
  EXPECT_SYSTEM_ERROR(file("nonexistent", file::RDONLY),
      ENOENT, "cannot open file nonexistent");
}